

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream * QtPrivate::readArrayBasedContainer<QList<QString>>(QDataStream *s,QList<QString> *c)

{
  QDataStream QVar1;
  QDataStream QVar2;
  char cVar3;
  QArrayData *asize;
  long in_FS_OFFSET;
  quint32 first;
  QString local_58;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar3 = QDataStream::isDeviceTransactionStarted();
  if (cVar3 == '\0') {
    QDataStream::resetStatus();
  }
  QList<QString>::clear(c);
  local_3c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_3c);
  asize = (QArrayData *)(ulong)local_3c;
  if (asize == (QArrayData *)0xfffffffe) {
    if (0x15 < *(int *)(s + 0x18)) {
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QDataStream::operator>>(s,(longlong *)&local_58);
      asize = &(local_58.d.d)->super_QArrayData;
      if ((long)local_58.d.d < 0) goto LAB_004f23ed;
    }
  }
  else if (local_3c == 0xffffffff) {
LAB_004f23ed:
    QDataStream::setStatus((Status)s);
    goto LAB_004f24b4;
  }
  QList<QString>::reserve(c,(qsizetype)asize);
  do {
    if (asize == (QArrayData *)0x0) break;
    asize = (QArrayData *)((long)&asize[-1].alloc + 7);
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_58.d.size = 0;
    ::operator>>(s,(QString *)&local_58);
    QVar2 = s[0x13];
    if (QVar2 == (QDataStream)0x0) {
      QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)c,(c->d).size,&local_58);
      QList<QString>::end(c);
    }
    else {
      QList<QString>::clear(c);
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  } while (QVar2 == (QDataStream)0x0);
LAB_004f24b4:
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}